

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

cf_errno_t cf_file_getcwd(cf_char_t *cwd,cf_size_t size)

{
  char *pcVar1;
  cf_size_t size_local;
  cf_char_t *cwd_local;
  
  if (cwd == (cf_char_t *)0x0) {
    cwd_local._4_4_ = 2;
  }
  else {
    pcVar1 = getcwd(cwd,size);
    cwd_local._4_4_ = (uint)(pcVar1 == (char *)0x0);
  }
  return cwd_local._4_4_;
}

Assistant:

cf_errno_t  cf_file_getcwd(cf_char_t* cwd, cf_size_t size) {
    if(!cwd) return CF_EPARAM;
#ifdef CF_OS_WIN
    return _getcwd(cwd, size) ? CF_OK : CF_NOK;
#else
    return getcwd(cwd, size) ? CF_OK : CF_NOK;
#endif
}